

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemTools::CheckTranslationPath(string *path)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  
  if (1 < path->_M_string_length) {
    std::__cxx11::string::push_back((char)path);
    p_Var3 = (_Rb_tree_node_base *)(Statics + 8);
    for (p_Var2 = *(_Rb_tree_node_base **)(Statics + 0x18); p_Var2 != p_Var3;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      lVar1 = std::__cxx11::string::find((char *)path,*(ulong *)(p_Var2 + 1),0);
      if (lVar1 == 0) {
        std::__cxx11::string::replace
                  ((ulong)path,0,(char *)p_Var2[1]._M_parent,*(ulong *)(p_Var2 + 2));
        std::__cxx11::string::_M_assign((string *)path);
      }
    }
    std::__cxx11::string::pop_back();
    return;
  }
  return;
}

Assistant:

void SystemTools::CheckTranslationPath(std::string& path)
{
  // Do not translate paths that are too short to have meaningful
  // translations.
  if (path.size() < 2) {
    return;
  }

  // Always add a trailing slash before translation.  It does not
  // matter if this adds an extra slash, but we do not want to
  // translate part of a directory (like the foo part of foo-dir).
  path += '/';

  // In case a file was specified we still have to go through this:
  // Now convert any path found in the table back to the one desired:
  for (auto const& pair : SystemTools::Statics->TranslationMap) {
    // We need to check of the path is a substring of the other path
    if (path.find(pair.first) == 0) {
      path = path.replace(0, pair.first.size(), pair.second);
    }
  }

  // Remove the trailing slash we added before.
  path.pop_back();
}